

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O3

void BrotliCompressFragmentTwoPassImpl16
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  char *pcVar1;
  size_t __n;
  long *plVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long *__s1;
  long *plVar8;
  byte bVar9;
  char *pcVar10;
  uint uVar11;
  long *input_00;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  size_t tail;
  size_t input_size_00;
  long *__s2;
  int *__s2_00;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long *__src;
  long *plVar19;
  bool bVar20;
  int local_9c;
  uint8_t *local_98;
  uint *local_90;
  
  input_00 = (long *)input;
  if (input_size != 0) {
    do {
      input_size_00 = 0x20000;
      if (input_size < 0x20000) {
        input_size_00 = input_size;
      }
      plVar2 = (long *)((long)input_00 + input_size_00);
      local_98 = literal_buf;
      local_90 = command_buf;
      __src = input_00;
      if (0xf < input_size) {
        uVar17 = input_size - 0x10;
        if (input_size_00 - 6 < input_size - 0x10) {
          uVar17 = input_size_00 - 6;
        }
        plVar19 = (long *)(uVar17 + (long)input_00);
        local_9c = -1;
        do {
          plVar8 = (long *)((long)__src + 1);
          uVar17 = (ulong)(*(long *)((long)__src + 1) * 0x1e35a7bd0000) >> 0x30;
          uVar11 = 0x20;
          do {
            lVar13 = *plVar8;
            __s1 = plVar8;
            uVar12 = uVar17;
            while( true ) {
              if ((uint)uVar12 != (uint)(ushort)((ulong)(lVar13 * 0x1e35a7bd0000) >> 0x30)) {
                __assert_fail("hash == Hash(ip, shift)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                              ,0x123,
                              "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                             );
              }
              plVar8 = (long *)((ulong)(uVar11 >> 5) + (long)__s1);
              if (plVar19 < plVar8) goto LAB_0012a52c;
              uVar17 = (ulong)(*plVar8 * 0x1e35a7bd0000) >> 0x30;
              iVar7 = (int)input;
              iVar6 = (int)__s1;
              if ((((*(int *)((long)__s1 + -(long)local_9c) == (int)lVar13) &&
                   (__s2 = (long *)((long)__s1 + -(long)local_9c),
                   *(char *)((long)__s1 + 4) == *(char *)((long)__s2 + 4))) &&
                  (*(char *)((long)__s1 + 5) == *(char *)((long)__s2 + 5))) && (0 < local_9c))
              break;
              if ((long)table[uVar12] < 0) {
                __assert_fail("candidate >= base_ip",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                              ,0x131,
                              "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                             );
              }
              __s2 = (long *)(input + table[uVar12]);
              if (__s1 <= __s2) {
                __assert_fail("candidate < ip",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                              ,0x132,
                              "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                             );
              }
              table[uVar12] = iVar6 - iVar7;
              if ((((int)*__s1 == (int)*__s2) &&
                  (*(char *)((long)__s1 + 4) == *(char *)((long)__s2 + 4))) &&
                 (*(char *)((long)__s1 + 5) == *(char *)((long)__s2 + 5))) goto LAB_00129f0e;
              lVar13 = *plVar8;
              uVar11 = uVar11 + 1;
              __s1 = plVar8;
              uVar12 = uVar17;
            }
            table[uVar12] = iVar6 - iVar7;
LAB_00129f0e:
            uVar11 = uVar11 + 1;
          } while (0x3fff0 < (long)__s1 - (long)__s2);
          pcVar1 = (char *)((long)__s1 + 6);
          uVar17 = (long)plVar2 + (-6 - (long)__s1);
          if (7 < uVar17) {
            uVar12 = uVar17 & 0xfffffffffffffff8;
            pcVar10 = pcVar1 + uVar12;
            lVar13 = 0;
            uVar18 = 0;
LAB_00129f63:
            uVar15 = *(ulong *)((long)__s2 + uVar18 * 8 + 6);
            if (*(ulong *)(pcVar1 + uVar18 * 8) == uVar15) goto code_r0x00129f71;
            uVar15 = uVar15 ^ *(ulong *)(pcVar1 + uVar18 * 8);
            uVar17 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar18 = (uVar17 >> 3 & 0x1fffffff) - lVar13;
            goto LAB_00129f98;
          }
          uVar12 = 0;
          pcVar10 = pcVar1;
LAB_0012a4e2:
          uVar17 = uVar17 & 7;
          uVar18 = uVar12;
          if (uVar17 != 0) {
            uVar15 = uVar12 | uVar17;
            do {
              uVar18 = uVar12;
              if (*(char *)((long)__s2 + uVar12 + 6) != *pcVar10) break;
              pcVar10 = pcVar10 + 1;
              uVar12 = uVar12 + 1;
              uVar17 = uVar17 - 1;
              uVar18 = uVar15;
            } while (uVar17 != 0);
          }
LAB_00129f98:
          __n = uVar18 + 6;
          iVar3 = bcmp(__s1,__s2,__n);
          if (iVar3 != 0) {
            __assert_fail("0 == memcmp(base, candidate, matched)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                          ,0x149,
                          "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                         );
          }
          uVar4 = iVar6 - (int)__src;
          uVar11 = uVar4;
          if (5 < uVar4) {
            if (uVar4 < 0x82) {
              uVar5 = uVar4 - 2;
              uVar11 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              bVar9 = (char)(uVar11 ^ 0xffffffe0) + 0x1f;
              uVar16 = uVar5 >> (bVar9 & 0x1f);
              uVar11 = (uVar5 - (uVar16 << (bVar9 & 0x1f))) * 0x100 |
                       uVar16 + (uVar11 ^ 0xffffffe0) * 2 + 0x40;
            }
            else if (uVar4 < 0x842) {
              uVar11 = 0x1f;
              if (uVar4 - 0x42 != 0) {
                for (; uVar4 - 0x42 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              uVar11 = (((-1 << ((byte)uVar11 & 0x1f)) + uVar4 + -0x42) * 0x100 - (uVar11 ^ 0x1f)) +
                       0x29;
            }
            else if (uVar4 < 0x1842) {
              uVar11 = uVar4 * 0x100 - 0x841eb;
            }
            else if (uVar4 < 0x5842) {
              uVar11 = uVar4 * 0x100 - 0x1841ea;
            }
            else {
              uVar11 = uVar4 * 0x100 - 0x5841e9;
            }
          }
          *local_90 = uVar11;
          memcpy(local_98,__src,(long)(int)uVar4);
          uVar11 = 0x40;
          iVar6 = (int)((long)__s1 - (long)__s2);
          if (local_9c != iVar6) {
            uVar5 = iVar6 + 3;
            uVar11 = 0x1f;
            if (uVar5 != 0) {
              for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            bVar9 = 0x1e - (char)(uVar11 ^ 0x1f);
            bVar20 = (uVar5 >> (bVar9 & 0x1f) & 1) != 0;
            uVar11 = ((uVar5 - (bVar20 + 2 << (bVar9 & 0x1f))) * 0x100 | (uVar11 ^ 0x1f) * 2 ^ 0x3e)
                     + (uint)bVar20 + 0x4c;
            local_9c = iVar6;
          }
          local_90[1] = uVar11;
          if (__n < 0xc) {
            uVar11 = (int)__n + 0x14;
LAB_0012a0c9:
            local_90[2] = uVar11;
            lVar13 = 0xc;
          }
          else {
            if (__n < 0x48) {
              uVar11 = 0x1f;
              uVar5 = (uint)(uVar18 - 2);
              if (uVar5 != 0) {
                for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              bVar9 = (char)(uVar11 ^ 0xffffffe0) + 0x1f;
              iVar6 = (int)(uVar18 - 2 >> (bVar9 & 0x3f));
              uVar11 = (uVar5 - (iVar6 << (bVar9 & 0x1f))) * 0x100 |
                       iVar6 + (uVar11 ^ 0xffffffe0) * 2 + 0x5a;
              goto LAB_0012a0c9;
            }
            if (__n < 0x88) {
              local_90[2] = ((uint)(uVar18 - 2) & 0x1f) << 8 | (int)(uVar18 - 2 >> 5) + 0x36U;
              local_90[3] = 0x40;
              lVar13 = 0x10;
            }
            else {
              if (__n < 0x848) {
                uVar11 = (int)uVar18 - 0x42;
                iVar6 = 0x1f;
                if (uVar11 != 0) {
                  for (; uVar11 >> iVar6 == 0; iVar6 = iVar6 + -1) {
                  }
                }
                local_90[2] = ((int)(-1L << ((byte)iVar6 & 0x3f)) + (int)uVar18 + -0x42) * 0x100 +
                              iVar6 + 0x34;
              }
              else {
                local_90[2] = (int)__n * 0x100 - 0x847c1;
              }
              local_90[3] = 0x40;
              lVar13 = 0x10;
            }
          }
          __src = (long *)((long)__s1 + uVar18 + 6);
          local_98 = local_98 + (int)uVar4;
          local_90 = (uint *)((long)local_90 + lVar13);
          if (plVar19 <= __src) break;
          uVar17 = *(ulong *)((long)__s1 + uVar18 + 1);
          iVar3 = (int)__src - iVar7;
          table[uVar17 * 0x1e35a7bd0000 >> 0x30] = iVar3 + -5;
          table[(uVar17 >> 8) * 0x1e35a7bd0000 >> 0x30] = iVar3 + -4;
          table[(uVar17 >> 0x10) * 0x1e35a7bd0000 >> 0x30] = iVar3 + -3;
          uVar17 = *(ulong *)((long)__s1 + uVar18 + 4);
          uVar12 = (uVar17 >> 0x10) * 0x1e35a7bd0000 >> 0x30;
          table[uVar17 * 0x1e35a7bd0000 >> 0x30] = iVar3 + -2;
          table[(uVar17 >> 8) * 0x1e35a7bd0000 >> 0x30] = iVar3 + -1;
          iVar6 = table[uVar12];
          table[uVar12] = iVar3;
          __s2_00 = (int *)(input + iVar6);
          lVar13 = (long)__src - (long)__s2_00;
          if ((lVar13 < 0x3fff1) && (plVar8 = __src, (int)*__src == *__s2_00)) {
            while ((__src = plVar8, *(char *)((long)plVar8 + 4) == (char)__s2_00[1] &&
                   (*(char *)((long)plVar8 + 5) == *(char *)((long)__s2_00 + 5)))) {
              pcVar1 = (char *)((long)plVar8 + 6);
              uVar17 = (long)plVar2 + (-6 - (long)plVar8);
              if (7 < uVar17) {
                uVar12 = uVar17 & 0xfffffffffffffff8;
                pcVar10 = pcVar1 + uVar12;
                lVar14 = 0;
                uVar18 = 0;
LAB_0012a1f7:
                uVar15 = *(ulong *)((long)__s2_00 + uVar18 * 8 + 6);
                if (*(ulong *)(pcVar1 + uVar18 * 8) == uVar15) goto code_r0x0012a205;
                uVar15 = uVar15 ^ *(ulong *)(pcVar1 + uVar18 * 8);
                uVar17 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar18 = (uVar17 >> 3 & 0x1fffffff) - lVar14;
                goto LAB_0012a22c;
              }
              uVar12 = 0;
              pcVar10 = pcVar1;
LAB_0012a3e1:
              uVar17 = uVar17 & 7;
              uVar18 = uVar12;
              if (uVar17 != 0) {
                uVar15 = uVar12 | uVar17;
                do {
                  uVar18 = uVar12;
                  if (*(char *)((long)__s2_00 + uVar12 + 6) != *pcVar10) break;
                  pcVar10 = pcVar10 + 1;
                  uVar12 = uVar12 + 1;
                  uVar17 = uVar17 - 1;
                  uVar18 = uVar15;
                } while (uVar17 != 0);
              }
LAB_0012a22c:
              uVar17 = uVar18 + 6;
              iVar6 = bcmp(plVar8,__s2_00,uVar17);
              if (iVar6 != 0) {
                __assert_fail("0 == memcmp(base, candidate, matched)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                              ,0x17a,
                              "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                             );
              }
              if (uVar17 < 10) {
                uVar11 = (int)uVar17 + 0x26;
              }
              else {
                uVar11 = (uint)uVar18;
                if (uVar17 < 0x86) {
                  uVar4 = 0x1f;
                  if (uVar11 != 0) {
                    for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                    }
                  }
                  bVar9 = (char)(uVar4 ^ 0xffffffe0) + 0x1f;
                  iVar6 = (int)(uVar18 >> (bVar9 & 0x3f));
                  uVar11 = (uVar11 - (iVar6 << (bVar9 & 0x1f))) * 0x100 |
                           iVar6 + (uVar4 ^ 0xffffffe0) * 2 + 0x6a;
                }
                else if (uVar17 < 0x846) {
                  iVar6 = 0x1f;
                  if (uVar11 - 0x40 != 0) {
                    for (; uVar11 - 0x40 >> iVar6 == 0; iVar6 = iVar6 + -1) {
                    }
                  }
                  uVar11 = iVar6 + ((int)(-1L << ((byte)iVar6 & 0x3f)) + uVar11 + -0x40) * 0x100 +
                           0x34;
                }
                else {
                  uVar11 = (int)uVar17 * 0x100 - 0x845c1;
                }
              }
              __src = (long *)((long)plVar8 + uVar18 + 6);
              *local_90 = uVar11;
              local_9c = (int)lVar13;
              uVar4 = local_9c + 3;
              uVar11 = 0x1f;
              if (uVar4 != 0) {
                for (; uVar4 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              bVar9 = 0x1e - (char)(uVar11 ^ 0x1f);
              bVar20 = (uVar4 >> (bVar9 & 0x1f) & 1) != 0;
              local_90[1] = ((uVar4 - (bVar20 + 2 << (bVar9 & 0x1f))) * 0x100 |
                            (uVar11 ^ 0x1f) * 2 ^ 0x3e) + (uint)bVar20 + 0x4c;
              local_90 = local_90 + 2;
              if (plVar19 <= __src) goto LAB_0012a52c;
              uVar17 = *(ulong *)((long)plVar8 + uVar18 + 1);
              iVar3 = (int)__src - iVar7;
              table[uVar17 * 0x1e35a7bd0000 >> 0x30] = iVar3 + -5;
              table[(uVar17 >> 8) * 0x1e35a7bd0000 >> 0x30] = iVar3 + -4;
              table[(uVar17 >> 0x10) * 0x1e35a7bd0000 >> 0x30] = iVar3 + -3;
              uVar17 = *(ulong *)((long)plVar8 + uVar18 + 4);
              uVar12 = (uVar17 >> 0x10) * 0x1e35a7bd0000 >> 0x30;
              table[uVar17 * 0x1e35a7bd0000 >> 0x30] = iVar3 + -2;
              table[(uVar17 >> 8) * 0x1e35a7bd0000 >> 0x30] = iVar3 + -1;
              iVar6 = table[uVar12];
              table[uVar12] = iVar3;
              __s2_00 = (int *)(input + iVar6);
              lVar13 = (long)__src - (long)__s2_00;
              if ((0x3fff0 < lVar13) || (plVar8 = __src, (int)*__src != *__s2_00)) break;
            }
          }
        } while( true );
      }
LAB_0012a52c:
      if (plVar2 < __src) {
        __assert_fail("next_emit <= ip_end",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                      ,0x19f,
                      "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                     );
      }
      if (__src < plVar2) {
        uVar11 = (uint)((long)plVar2 - (long)__src);
        if (5 < uVar11) {
          if (uVar11 < 0x82) {
            uVar11 = uVar11 - 2;
            uVar4 = 0x1f;
            if (uVar11 != 0) {
              for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            bVar9 = (char)(uVar4 ^ 0xffffffe0) + 0x1f;
            uVar5 = uVar11 >> (bVar9 & 0x1f);
            uVar11 = (uVar11 - (uVar5 << (bVar9 & 0x1f))) * 0x100 |
                     uVar5 + (uVar4 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar11 < 0x842) {
            uVar4 = 0x1f;
            if (uVar11 - 0x42 != 0) {
              for (; uVar11 - 0x42 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            uVar11 = (((-1 << ((byte)uVar4 & 0x1f)) + uVar11 + -0x42) * 0x100 - (uVar4 ^ 0x1f)) +
                     0x29;
          }
          else {
            iVar7 = uVar11 * 0x100;
            if (uVar11 < 0x1842) {
              uVar11 = iVar7 - 0x841eb;
            }
            else if (uVar11 < 0x5842) {
              uVar11 = iVar7 - 0x1841ea;
            }
            else {
              uVar11 = iVar7 - 0x5841e9;
            }
          }
        }
        *local_90 = uVar11;
        local_90 = local_90 + 1;
        uVar17 = (long)plVar2 - (long)__src & 0xffffffff;
        memcpy(local_98,__src,uVar17);
        local_98 = local_98 + uVar17;
      }
      iVar7 = ShouldCompress((uint8_t *)input_00,input_size_00,(long)local_98 - (long)literal_buf);
      if (iVar7 == 0) {
        BrotliStoreMetaBlockHeader(input_size_00,1,storage_ix,storage);
        uVar11 = (int)*storage_ix + 7;
        *storage_ix = (ulong)(uVar11 & 0xfffffff8);
        memcpy(storage + (uVar11 >> 3),input_00,input_size_00);
        uVar17 = input_size_00 * 8 + *storage_ix;
        *storage_ix = uVar17;
        storage[uVar17 >> 3] = '\0';
      }
      else {
        BrotliStoreMetaBlockHeader(input_size_00,0,storage_ix,storage);
        uVar17 = *storage_ix;
        uVar12 = uVar17 >> 3;
        *(ulong *)(storage + uVar12) = (ulong)storage[uVar12];
        *storage_ix = uVar17 + 0xd;
        StoreCommands(m,literal_buf,(long)local_98 - (long)literal_buf,command_buf,
                      (long)local_90 - (long)command_buf >> 2,storage_ix,storage);
      }
      input_size = input_size - input_size_00;
      input_00 = plVar2;
    } while (input_size != 0);
  }
  if (is_last != 0) {
    uVar12 = *storage_ix;
    *(ulong *)(storage + (uVar12 >> 3)) = (ulong)storage[uVar12 >> 3] | 1L << ((byte)uVar12 & 7);
    uVar17 = uVar12 + 1;
    *storage_ix = uVar17;
    *(ulong *)(storage + (uVar17 >> 3)) = (ulong)storage[uVar17 >> 3] | 1L << ((byte)uVar17 & 7);
    *storage_ix = (ulong)((int)uVar12 + 9U & 0xfffffff8);
  }
  return;
code_r0x00129f71:
  uVar18 = uVar18 + 1;
  lVar13 = lVar13 + -8;
  if (uVar17 >> 3 == uVar18) goto LAB_0012a4e2;
  goto LAB_00129f63;
code_r0x0012a205:
  uVar18 = uVar18 + 1;
  lVar14 = lVar14 + -8;
  if (uVar17 >> 3 == uVar18) goto LAB_0012a3e1;
  goto LAB_0012a1f7;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: assert(0); break;
  }
}